

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

void __thiscall cmDebugServerConsole::OnChangeState(cmDebugServerConsole *this)

{
  OnChangeState((cmDebugServerConsole *)
                &this[-1].super_cmDebugServer.super_cmServerBase.ShutdownSignal.handleMutex.
                 super___mutex_base._M_mutex.__data.__list);
  return;
}

Assistant:

void cmDebugServerConsole::OnChangeState()
{
  cmDebugServer::OnChangeState();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      AsyncBroadcast("Running...\n");
      break;
    case cmDebugger::State::Paused: {
      auto ctx = Debugger.PauseContext();
      if (ctx) {
        auto currentLine = ctx.CurrentLine();
        AsyncBroadcast("Paused at " + currentLine.FilePath + ":" +
                       std::to_string(currentLine.Line) + " (" +
                       currentLine.Name + ")\n");
      } else {
        AsyncBroadcast("Paused at indeterminate state\n");
      }
      AsyncBroadcast(PROMPT);
    } break;
    case cmDebugger::State::Unknown:
      AsyncBroadcast("Unknown state\n");
      printPrompt();
      break;
  }
}